

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O3

string * __thiscall
vkt::drawutil::getPrimitiveTopologyShortName_abi_cxx11_
          (string *__return_storage_ptr__,drawutil *this,VkPrimitiveTopology topology)

{
  char *__s;
  string name;
  string local_50;
  long *local_30 [2];
  long local_20 [2];
  
  __s = ::vk::getPrimitiveTopologyName((VkPrimitiveTopology)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,__s,(allocator<char> *)&local_50);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)local_30);
  de::toLower(__return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getPrimitiveTopologyShortName (const VkPrimitiveTopology topology)
{
	std::string name(getPrimitiveTopologyName(topology));
	return de::toLower(name.substr(22));
}